

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O0

void __thiscall CMU462::Timeline::draw(Timeline *this)

{
  bool bVar1;
  int iVar2;
  reference piVar3;
  double dVar4;
  double y1;
  double size_00;
  double current_x;
  double t_x;
  _Self local_50;
  iterator iter;
  double line_w;
  double size;
  double b_y;
  double b_x;
  int i;
  double border_size;
  double button_start_x;
  Timeline *this_local;
  
  glColor4f();
  drawRectangle(this,(double)this->x,(double)this->y,(double)(this->x + this->w),
                (double)(this->y + this->h));
  iVar2 = getButtonStartX(this);
  for (b_x._4_4_ = 0; b_x._4_4_ < 6; b_x._4_4_ = b_x._4_4_ + 1) {
    dVar4 = (double)iVar2 + (double)(b_x._4_4_ * this->h) + 2.0;
    y1 = (double)this->y + 2.0;
    size_00 = (double)this->h + -4.0;
    glColor4f();
    drawRectangle(this,dVar4,y1,dVar4 + size_00,y1 + size_00);
    if ((b_x._4_4_ == 5) && ((this->isLooping & 1U) != 0)) {
      glColor4f();
    }
    else if (this->hover_button_index == b_x._4_4_) {
      glColor4f();
    }
    else {
      glColor4f();
    }
    drawButton(this,b_x._4_4_,dVar4,y1,size_00);
  }
  glColor4f();
  glColor4f();
  iter._M_node = (_Base_ptr)((double)iVar2 - (double)this->x);
  local_50._M_node =
       (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&this->times);
  while( true ) {
    t_x = (double)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->times);
    bVar1 = std::operator!=(&local_50,(_Self *)&t_x);
    if (!bVar1) break;
    iVar2 = this->x;
    piVar3 = std::_Rb_tree_const_iterator<int>::operator*(&local_50);
    dVar4 = (((double)*piVar3 * 1.0) / (double)this->max_frame) * (double)iter._M_node +
            (double)iVar2;
    drawRectangle(this,dVar4,(double)this->y + 4.0,dVar4 + 1.0,(double)(this->y + this->h) + -4.0);
    std::_Rb_tree_const_iterator<int>::operator++(&local_50,0);
  }
  glColor4f();
  dVar4 = (((double)this->current_frame * 1.0) / (double)this->max_frame) * (double)iter._M_node +
          (double)this->x;
  drawRectangle(this,dVar4 - 2.0,(double)this->y + 2.0,dVar4,(double)(this->y + this->h) - 2.0);
  return;
}

Assistant:

void Timeline::draw()
  {

    // -- White with opacity .8;
    glColor4f(1.0, 1.0, 1.0, 0.8);

    drawRectangle(x, y, x + w, y + h);

    double button_start_x = getButtonStartX();
    double border_size = 2;

    for(int i = 0; i < 6; i++)
    {

      // Draw each button.
      // Draw a button highlighted if hover_button_index == i.
      double b_x  = button_start_x + i*h + border_size;
      double b_y  = y + border_size;
      double size = h - border_size*2;

      // Backgrounds for each button.
      // Black with opacity .3
      glColor4f(0.0, 0.0, 0.0, 0.3);
      drawRectangle(b_x, b_y, b_x + size, b_y + size);

      // Boolean button is enabled.
      if(i == LOOP && isLooping)
      {
      glColor4f(0.0, 0.0, 1.0, 1.0);
      }
      // Mouse hover
      else if(hover_button_index == i)
      {
      // Red.
      glColor4f(1.0, 0.0, 0.0, 1.0);
      }
      // Default, no hover, not enabled.
      else
      {
      // Faded red.
      glColor4f(0.3, 0.0, 0.0, 0.8);
      }

      drawButton(i, b_x, b_y, size);
    }

      // -- Draw the timeline with its various key frame locations.

    // First draw the timeline background.
    // Black with opacity .3
    glColor4f(0.0, 0.0, 0.0, 0.3);

    // Key frame time indicator color, (BLUE).
    glColor4f(0.0, 0.0, 1.0, .7);

    double line_w = button_start_x - x;

    for(set<int>::iterator iter = times.begin(); iter != times.end(); iter++)
      {

        // Draw a rectangle at x + (*iter)/max_frame * w to indicate keyframe times
      double t_x = x + (*iter)*1.0/max_frame * line_w;
      drawRectangle(t_x, y + border_size *2, t_x + 1, y + h - border_size*2);
      }

    glColor4f(1.0, 0.0, 0.0, 1.0);

    double current_x = x + current_frame*1.0/max_frame * line_w;
    drawRectangle(current_x - 2, y + border_size,
            current_x, y + h - border_size);


  }